

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  ulong uVar12;
  Scene *pSVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [32];
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a9;
  ulong local_13a8;
  undefined1 local_13a0 [16];
  undefined8 local_1390;
  float fStack_1388;
  float fStack_1384;
  Scene *local_1380;
  undefined8 uStack_1378;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  size_t local_1318;
  RayHitK<8> *local_1310;
  long local_1308;
  ulong local_1300;
  ulong local_12f8;
  RTCFilterFunctionNArguments local_12f0;
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 *local_1280;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [32];
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [16];
  undefined1 auStack_10b0 [16];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar50 [32];
  
  pauVar10 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1150._4_4_ = uVar9;
  local_1150._0_4_ = uVar9;
  local_1150._8_4_ = uVar9;
  local_1150._12_4_ = uVar9;
  auVar82 = ZEXT1664(local_1150);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1160._4_4_ = uVar9;
  local_1160._0_4_ = uVar9;
  local_1160._8_4_ = uVar9;
  local_1160._12_4_ = uVar9;
  auVar84 = ZEXT1664(local_1160);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1170._4_4_ = uVar9;
  local_1170._0_4_ = uVar9;
  local_1170._8_4_ = uVar9;
  local_1170._12_4_ = uVar9;
  auVar85 = ZEXT1664(local_1170);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar112 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar92 = fVar106 * 0.99999964;
  fVar96 = fVar112 * 0.99999964;
  fVar97 = fVar116 * 0.99999964;
  fVar106 = fVar106 * 1.0000004;
  fVar112 = fVar112 * 1.0000004;
  fVar116 = fVar116 * 1.0000004;
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1300 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar21 = uVar17 ^ 0x10;
  uVar23 = local_12f8 ^ 0x10;
  uVar20 = local_1300 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_12c0._4_4_ = iVar8;
  local_12c0._0_4_ = iVar8;
  local_12c0._8_4_ = iVar8;
  local_12c0._12_4_ = iVar8;
  auVar78 = ZEXT1664(local_12c0);
  iVar8 = (tray->tfar).field_0.i[k];
  auVar30 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar39._4_4_ = iVar8;
  auVar39._0_4_ = iVar8;
  auVar39._8_4_ = iVar8;
  auVar39._12_4_ = iVar8;
  auVar39._16_4_ = iVar8;
  auVar39._20_4_ = iVar8;
  auVar39._24_4_ = iVar8;
  auVar39._28_4_ = iVar8;
  auVar50 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar39 = vpand_avx2(auVar39,auVar50);
  local_10e0 = vpcmpeqd_avx2(auVar39,auVar50);
  local_1180 = fVar92;
  fStack_117c = fVar92;
  fStack_1178 = fVar92;
  fStack_1174 = fVar92;
  local_1190 = fVar96;
  fStack_118c = fVar96;
  fStack_1188 = fVar96;
  fStack_1184 = fVar96;
  local_11a0 = fVar97;
  fStack_119c = fVar97;
  fStack_1198 = fVar97;
  fStack_1194 = fVar97;
  local_11b0 = fVar106;
  fStack_11ac = fVar106;
  fStack_11a8 = fVar106;
  fStack_11a4 = fVar106;
  local_11c0 = fVar112;
  fStack_11bc = fVar112;
  fStack_11b8 = fVar112;
  fStack_11b4 = fVar112;
  local_11d0 = fVar116;
  fStack_11cc = fVar116;
  fStack_11c8 = fVar116;
  fStack_11c4 = fVar116;
  local_1310 = ray;
  local_1318 = k;
  local_13a8 = uVar17;
  fVar115 = fVar116;
  fVar114 = fVar116;
  fVar113 = fVar116;
  fVar111 = fVar112;
  fVar110 = fVar112;
  fVar107 = fVar112;
  fVar104 = fVar106;
  fVar102 = fVar106;
  fVar105 = fVar106;
  fVar103 = fVar97;
  fVar101 = fVar97;
  fVar98 = fVar97;
  fVar95 = fVar96;
  fVar94 = fVar96;
  fVar93 = fVar96;
  fVar91 = fVar92;
  fVar90 = fVar92;
  fVar86 = fVar92;
LAB_00569673:
  do {
    pauVar7 = pauVar10 + -1;
    pauVar10 = pauVar10 + -1;
    if (*(float *)(*pauVar7 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar22 = *(ulong *)*pauVar10;
      while ((uVar22 & 8) == 0) {
        uVar18 = uVar22 & 0xfffffffffffffff0;
        uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar31._4_4_ = uVar9;
        auVar31._0_4_ = uVar9;
        auVar31._8_4_ = uVar9;
        auVar31._12_4_ = uVar9;
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar17),auVar31,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar17));
        auVar33 = vsubps_avx(auVar33,auVar82._0_16_);
        auVar32._0_4_ = fVar86 * auVar33._0_4_;
        auVar32._4_4_ = fVar90 * auVar33._4_4_;
        auVar32._8_4_ = fVar91 * auVar33._8_4_;
        auVar32._12_4_ = fVar92 * auVar33._12_4_;
        auVar33 = vmaxps_avx(auVar78._0_16_,auVar32);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_12f8),auVar31,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_12f8));
        auVar32 = vsubps_avx(auVar32,auVar84._0_16_);
        auVar51._0_4_ = fVar93 * auVar32._0_4_;
        auVar51._4_4_ = fVar94 * auVar32._4_4_;
        auVar51._8_4_ = fVar95 * auVar32._8_4_;
        auVar51._12_4_ = fVar96 * auVar32._12_4_;
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + local_1300),auVar31,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + local_1300));
        auVar32 = vsubps_avx(auVar32,auVar85._0_16_);
        auVar57._0_4_ = fVar98 * auVar32._0_4_;
        auVar57._4_4_ = fVar101 * auVar32._4_4_;
        auVar57._8_4_ = fVar103 * auVar32._8_4_;
        auVar57._12_4_ = fVar97 * auVar32._12_4_;
        auVar32 = vmaxps_avx(auVar51,auVar57);
        auVar33 = vmaxps_avx(auVar33,auVar32);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar21),auVar31,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar21));
        auVar32 = vsubps_avx(auVar32,auVar82._0_16_);
        auVar52._0_4_ = fVar105 * auVar32._0_4_;
        auVar52._4_4_ = fVar102 * auVar32._4_4_;
        auVar52._8_4_ = fVar104 * auVar32._8_4_;
        auVar52._12_4_ = fVar106 * auVar32._12_4_;
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar23),auVar31,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar23));
        auVar32 = vsubps_avx(auVar32,auVar84._0_16_);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar20),auVar31,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar20));
        auVar58._0_4_ = fVar107 * auVar32._0_4_;
        auVar58._4_4_ = fVar110 * auVar32._4_4_;
        auVar58._8_4_ = fVar111 * auVar32._8_4_;
        auVar58._12_4_ = fVar112 * auVar32._12_4_;
        auVar32 = vsubps_avx(auVar51,auVar85._0_16_);
        auVar67._0_4_ = fVar113 * auVar32._0_4_;
        auVar67._4_4_ = fVar114 * auVar32._4_4_;
        auVar67._8_4_ = fVar115 * auVar32._8_4_;
        auVar67._12_4_ = fVar116 * auVar32._12_4_;
        auVar32 = vminps_avx(auVar58,auVar67);
        auVar51 = vminps_avx(auVar30._0_16_,auVar52);
        auVar32 = vminps_avx(auVar51,auVar32);
        if (((uint)uVar22 & 7) == 6) {
          auVar51 = vcmpps_avx(auVar33,auVar32,2);
          auVar32 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0xe0),auVar31,2);
          auVar31 = vcmpps_avx(auVar31,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
          auVar32 = vandps_avx(auVar32,auVar31);
          auVar32 = vandps_avx(auVar32,auVar51);
        }
        else {
          auVar32 = vcmpps_avx(auVar33,auVar32,2);
        }
        auVar32 = vpslld_avx(auVar32,0x1f);
        uVar11 = vmovmskps_avx(auVar32);
        local_10c0 = (RTCHitN  [16])auVar33;
        if (uVar11 == 0) {
          if (pauVar10 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_00569673;
        }
        uVar11 = uVar11 & 0xff;
        lVar16 = 0;
        for (uVar22 = (ulong)uVar11; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar22 = *(ulong *)(uVar18 + lVar16 * 8);
        uVar11 = uVar11 - 1 & uVar11;
        uVar12 = (ulong)uVar11;
        if (uVar11 != 0) {
          uVar2 = *(uint *)(local_10c0 + lVar16 * 4);
          lVar16 = 0;
          for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          uVar15 = (ulong)uVar11;
          uVar12 = *(ulong *)(uVar18 + lVar16 * 8);
          uVar3 = *(uint *)(local_10c0 + lVar16 * 4);
          uVar17 = local_13a8;
          if (uVar11 == 0) {
            if (uVar2 < uVar3) {
              *(ulong *)*pauVar10 = uVar12;
              *(uint *)(*pauVar10 + 8) = uVar3;
              pauVar10 = pauVar10 + 1;
            }
            else {
              *(ulong *)*pauVar10 = uVar22;
              *(uint *)(*pauVar10 + 8) = uVar2;
              pauVar10 = pauVar10 + 1;
              uVar22 = uVar12;
            }
          }
          else {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar22;
            auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar2));
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar12;
            auVar32 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar3));
            lVar16 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar11 = uVar11 - 1 & uVar11;
            uVar22 = (ulong)uVar11;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = *(ulong *)(uVar18 + lVar16 * 8);
            auVar31 = vpunpcklqdq_avx(auVar53,ZEXT416(*(uint *)(local_10c0 + lVar16 * 4)));
            auVar51 = vpcmpgtd_avx(auVar32,auVar33);
            if (uVar11 == 0) {
              auVar52 = vpshufd_avx(auVar51,0xaa);
              auVar51 = vblendvps_avx(auVar32,auVar33,auVar52);
              auVar33 = vblendvps_avx(auVar33,auVar32,auVar52);
              auVar32 = vpcmpgtd_avx(auVar31,auVar51);
              auVar52 = vpshufd_avx(auVar32,0xaa);
              auVar32 = vblendvps_avx(auVar31,auVar51,auVar52);
              auVar51 = vblendvps_avx(auVar51,auVar31,auVar52);
              auVar31 = vpcmpgtd_avx(auVar51,auVar33);
              auVar52 = vpshufd_avx(auVar31,0xaa);
              auVar31 = vblendvps_avx(auVar51,auVar33,auVar52);
              auVar33 = vblendvps_avx(auVar33,auVar51,auVar52);
              *pauVar10 = auVar33;
              pauVar10[1] = auVar31;
              uVar22 = auVar32._0_8_;
              pauVar10 = pauVar10 + 2;
            }
            else {
              lVar16 = 0;
              for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              auVar68._8_8_ = 0;
              auVar68._0_8_ = *(ulong *)(uVar18 + lVar16 * 8);
              auVar57 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_10c0 + lVar16 * 4)));
              auVar52 = vpshufd_avx(auVar51,0xaa);
              auVar51 = vblendvps_avx(auVar32,auVar33,auVar52);
              auVar33 = vblendvps_avx(auVar33,auVar32,auVar52);
              auVar32 = vpcmpgtd_avx(auVar57,auVar31);
              auVar52 = vpshufd_avx(auVar32,0xaa);
              auVar32 = vblendvps_avx(auVar57,auVar31,auVar52);
              auVar31 = vblendvps_avx(auVar31,auVar57,auVar52);
              auVar52 = vpcmpgtd_avx(auVar31,auVar33);
              auVar57 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar31,auVar33,auVar57);
              auVar33 = vblendvps_avx(auVar33,auVar31,auVar57);
              auVar31 = vpcmpgtd_avx(auVar32,auVar51);
              auVar57 = vpshufd_avx(auVar31,0xaa);
              auVar31 = vblendvps_avx(auVar32,auVar51,auVar57);
              auVar32 = vblendvps_avx(auVar51,auVar32,auVar57);
              auVar51 = vpcmpgtd_avx(auVar52,auVar32);
              auVar57 = vpshufd_avx(auVar51,0xaa);
              auVar51 = vblendvps_avx(auVar52,auVar32,auVar57);
              auVar32 = vblendvps_avx(auVar32,auVar52,auVar57);
              *pauVar10 = auVar33;
              pauVar10[1] = auVar32;
              pauVar10[2] = auVar51;
              auVar78 = ZEXT1664(local_12c0);
              uVar22 = auVar31._0_8_;
              pauVar10 = pauVar10 + 3;
            }
          }
        }
      }
      local_1308 = (ulong)((uint)uVar22 & 0xf) - 8;
      if (local_1308 != 0) {
        uVar22 = uVar22 & 0xfffffffffffffff0;
        lVar16 = 0;
        do {
          lVar19 = lVar16 * 0x140;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar59._4_4_ = uVar9;
          auVar59._0_4_ = uVar9;
          auVar59._8_4_ = uVar9;
          auVar59._12_4_ = uVar9;
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x90 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + lVar19));
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xa0 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x10 + lVar19));
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xb0 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x20 + lVar19));
          auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xc0 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x30 + lVar19));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xd0 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x40 + lVar19));
          auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xe0 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x50 + lVar19));
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xf0 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x60 + lVar19));
          auVar67 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x100 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x70 + lVar19));
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x110 + lVar19),auVar59,
                                    *(undefined1 (*) [16])(uVar22 + 0x80 + lVar19));
          uVar9 = *(undefined4 *)(ray + k * 4);
          auVar60._4_4_ = uVar9;
          auVar60._0_4_ = uVar9;
          auVar60._8_4_ = uVar9;
          auVar60._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar99._4_4_ = uVar9;
          auVar99._0_4_ = uVar9;
          auVar99._8_4_ = uVar9;
          auVar99._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar108._4_4_ = uVar9;
          auVar108._0_4_ = uVar9;
          auVar108._8_4_ = uVar9;
          auVar108._12_4_ = uVar9;
          local_1340 = vsubps_avx(auVar33,auVar60);
          local_1350 = vsubps_avx(auVar32,auVar99);
          auVar33 = vsubps_avx(auVar51,auVar108);
          auVar32 = vsubps_avx(auVar31,auVar60);
          auVar51 = vsubps_avx(auVar52,auVar99);
          auVar31 = vsubps_avx(auVar57,auVar108);
          auVar52 = vsubps_avx(auVar58,auVar60);
          auVar57 = vsubps_avx(auVar67,auVar99);
          auVar58 = vsubps_avx(auVar41,auVar108);
          auVar67 = vsubps_avx(auVar52,local_1340);
          local_1100 = vsubps_avx(auVar57,local_1350);
          local_10f0 = vsubps_avx(auVar58,auVar33);
          auVar24._0_4_ = auVar52._0_4_ + local_1340._0_4_;
          auVar24._4_4_ = auVar52._4_4_ + local_1340._4_4_;
          auVar24._8_4_ = auVar52._8_4_ + local_1340._8_4_;
          auVar24._12_4_ = auVar52._12_4_ + local_1340._12_4_;
          auVar54._0_4_ = auVar57._0_4_ + local_1350._0_4_;
          auVar54._4_4_ = auVar57._4_4_ + local_1350._4_4_;
          auVar54._8_4_ = auVar57._8_4_ + local_1350._8_4_;
          auVar54._12_4_ = auVar57._12_4_ + local_1350._12_4_;
          fVar106 = auVar33._0_4_;
          auVar61._0_4_ = auVar58._0_4_ + fVar106;
          fVar112 = auVar33._4_4_;
          auVar61._4_4_ = auVar58._4_4_ + fVar112;
          fVar116 = auVar33._8_4_;
          auVar61._8_4_ = auVar58._8_4_ + fVar116;
          fVar92 = auVar33._12_4_;
          auVar61._12_4_ = auVar58._12_4_ + fVar92;
          auVar100._0_4_ = auVar54._0_4_ * local_10f0._0_4_;
          auVar100._4_4_ = auVar54._4_4_ * local_10f0._4_4_;
          auVar100._8_4_ = auVar54._8_4_ * local_10f0._8_4_;
          auVar100._12_4_ = auVar54._12_4_ * local_10f0._12_4_;
          auVar53 = vfmsub231ps_fma(auVar100,local_1100,auVar61);
          auVar62._0_4_ = auVar61._0_4_ * auVar67._0_4_;
          auVar62._4_4_ = auVar61._4_4_ * auVar67._4_4_;
          auVar62._8_4_ = auVar61._8_4_ * auVar67._8_4_;
          auVar62._12_4_ = auVar61._12_4_ * auVar67._12_4_;
          auVar41 = vfmsub231ps_fma(auVar62,local_10f0,auVar24);
          auVar25._0_4_ = local_1100._0_4_ * auVar24._0_4_;
          auVar25._4_4_ = local_1100._4_4_ * auVar24._4_4_;
          auVar25._8_4_ = local_1100._8_4_ * auVar24._8_4_;
          auVar25._12_4_ = local_1100._12_4_ * auVar24._12_4_;
          auVar68 = vfmsub231ps_fma(auVar25,auVar67,auVar54);
          local_1390._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar83._0_4_ = local_1390._4_4_ * auVar68._0_4_;
          auVar83._4_4_ = local_1390._4_4_ * auVar68._4_4_;
          auVar83._8_4_ = local_1390._4_4_ * auVar68._8_4_;
          auVar83._12_4_ = local_1390._4_4_ * auVar68._12_4_;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0xa0);
          local_13a0._4_4_ = uVar9;
          local_13a0._0_4_ = uVar9;
          local_13a0._8_4_ = uVar9;
          local_13a0._12_4_ = uVar9;
          auVar41 = vfmadd231ps_fma(auVar83,local_13a0,auVar41);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar109._4_4_ = uVar9;
          auVar109._0_4_ = uVar9;
          auVar109._8_4_ = uVar9;
          auVar109._12_4_ = uVar9;
          local_1130 = vfmadd231ps_fma(auVar41,auVar109,auVar53);
          local_1110 = vsubps_avx(local_1350,auVar51);
          local_1120 = vsubps_avx(auVar33,auVar31);
          auVar55._0_4_ = local_1350._0_4_ + auVar51._0_4_;
          auVar55._4_4_ = local_1350._4_4_ + auVar51._4_4_;
          auVar55._8_4_ = local_1350._8_4_ + auVar51._8_4_;
          auVar55._12_4_ = local_1350._12_4_ + auVar51._12_4_;
          auVar63._0_4_ = fVar106 + auVar31._0_4_;
          auVar63._4_4_ = fVar112 + auVar31._4_4_;
          auVar63._8_4_ = fVar116 + auVar31._8_4_;
          auVar63._12_4_ = fVar92 + auVar31._12_4_;
          fVar96 = local_1120._0_4_;
          auVar72._0_4_ = auVar55._0_4_ * fVar96;
          fVar86 = local_1120._4_4_;
          auVar72._4_4_ = auVar55._4_4_ * fVar86;
          fVar91 = local_1120._8_4_;
          auVar72._8_4_ = auVar55._8_4_ * fVar91;
          fVar94 = local_1120._12_4_;
          auVar72._12_4_ = auVar55._12_4_ * fVar94;
          auVar53 = vfmsub231ps_fma(auVar72,local_1110,auVar63);
          auVar41 = vsubps_avx(local_1340,auVar32);
          fVar97 = auVar41._0_4_;
          auVar79._0_4_ = auVar63._0_4_ * fVar97;
          fVar90 = auVar41._4_4_;
          auVar79._4_4_ = auVar63._4_4_ * fVar90;
          fVar93 = auVar41._8_4_;
          auVar79._8_4_ = auVar63._8_4_ * fVar93;
          fVar95 = auVar41._12_4_;
          auVar79._12_4_ = auVar63._12_4_ * fVar95;
          auVar64._0_4_ = local_1340._0_4_ + auVar32._0_4_;
          auVar64._4_4_ = local_1340._4_4_ + auVar32._4_4_;
          auVar64._8_4_ = local_1340._8_4_ + auVar32._8_4_;
          auVar64._12_4_ = local_1340._12_4_ + auVar32._12_4_;
          auVar33 = vfmsub231ps_fma(auVar79,local_1120,auVar64);
          fVar98 = local_1110._0_4_;
          auVar65._0_4_ = fVar98 * auVar64._0_4_;
          fVar101 = local_1110._4_4_;
          auVar65._4_4_ = fVar101 * auVar64._4_4_;
          fVar103 = local_1110._8_4_;
          auVar65._8_4_ = fVar103 * auVar64._8_4_;
          fVar105 = local_1110._12_4_;
          auVar65._12_4_ = fVar105 * auVar64._12_4_;
          auVar68 = vfmsub231ps_fma(auVar65,auVar41,auVar55);
          auVar66._0_4_ = local_1390._4_4_ * auVar68._0_4_;
          auVar66._4_4_ = local_1390._4_4_ * auVar68._4_4_;
          auVar66._8_4_ = local_1390._4_4_ * auVar68._8_4_;
          auVar66._12_4_ = local_1390._4_4_ * auVar68._12_4_;
          auVar33 = vfmadd231ps_fma(auVar66,local_13a0,auVar33);
          local_12a0 = vfmadd231ps_fma(auVar33,auVar109,auVar53);
          auVar53 = vsubps_avx(auVar32,auVar52);
          auVar42._0_4_ = auVar32._0_4_ + auVar52._0_4_;
          auVar42._4_4_ = auVar32._4_4_ + auVar52._4_4_;
          auVar42._8_4_ = auVar32._8_4_ + auVar52._8_4_;
          auVar42._12_4_ = auVar32._12_4_ + auVar52._12_4_;
          auVar52 = vsubps_avx(auVar51,auVar57);
          auVar34._0_4_ = auVar51._0_4_ + auVar57._0_4_;
          auVar34._4_4_ = auVar51._4_4_ + auVar57._4_4_;
          auVar34._8_4_ = auVar51._8_4_ + auVar57._8_4_;
          auVar34._12_4_ = auVar51._12_4_ + auVar57._12_4_;
          auVar51 = vsubps_avx(auVar31,auVar58);
          auVar69._0_4_ = auVar31._0_4_ + auVar58._0_4_;
          auVar69._4_4_ = auVar31._4_4_ + auVar58._4_4_;
          auVar69._8_4_ = auVar31._8_4_ + auVar58._8_4_;
          auVar69._12_4_ = auVar31._12_4_ + auVar58._12_4_;
          auVar73._0_4_ = auVar51._0_4_ * auVar34._0_4_;
          auVar73._4_4_ = auVar51._4_4_ * auVar34._4_4_;
          auVar73._8_4_ = auVar51._8_4_ * auVar34._8_4_;
          auVar73._12_4_ = auVar51._12_4_ * auVar34._12_4_;
          auVar32 = vfmsub231ps_fma(auVar73,auVar52,auVar69);
          auVar70._0_4_ = auVar69._0_4_ * auVar53._0_4_;
          auVar70._4_4_ = auVar69._4_4_ * auVar53._4_4_;
          auVar70._8_4_ = auVar69._8_4_ * auVar53._8_4_;
          auVar70._12_4_ = auVar69._12_4_ * auVar53._12_4_;
          auVar33 = vfmsub231ps_fma(auVar70,auVar51,auVar42);
          auVar43._0_4_ = auVar52._0_4_ * auVar42._0_4_;
          auVar43._4_4_ = auVar52._4_4_ * auVar42._4_4_;
          auVar43._8_4_ = auVar52._8_4_ * auVar42._8_4_;
          auVar43._12_4_ = auVar52._12_4_ * auVar42._12_4_;
          auVar31 = vfmsub231ps_fma(auVar43,auVar53,auVar34);
          local_1390._0_4_ = local_1390._4_4_;
          fStack_1388 = local_1390._4_4_;
          fStack_1384 = local_1390._4_4_;
          auVar44._0_4_ = local_1390._4_4_ * auVar31._0_4_;
          auVar44._4_4_ = local_1390._4_4_ * auVar31._4_4_;
          auVar44._8_4_ = local_1390._4_4_ * auVar31._8_4_;
          auVar44._12_4_ = local_1390._4_4_ * auVar31._12_4_;
          auVar33 = vfmadd231ps_fma(auVar44,local_13a0,auVar33);
          auVar31 = vfmadd231ps_fma(auVar33,auVar109,auVar32);
          local_12b0 = local_1130._0_4_;
          fStack_12ac = local_1130._4_4_;
          fStack_12a8 = local_1130._8_4_;
          fStack_12a4 = local_1130._12_4_;
          local_1290._0_4_ = auVar31._0_4_ + local_12b0 + local_12a0._0_4_;
          local_1290._4_4_ = auVar31._4_4_ + fStack_12ac + local_12a0._4_4_;
          local_1290._8_4_ = auVar31._8_4_ + fStack_12a8 + local_12a0._8_4_;
          local_1290._12_4_ = auVar31._12_4_ + fStack_12a4 + local_12a0._12_4_;
          auVar35._8_4_ = 0x7fffffff;
          auVar35._0_8_ = 0x7fffffff7fffffff;
          auVar35._12_4_ = 0x7fffffff;
          auVar33 = vminps_avx(local_1130,local_12a0);
          auVar33 = vminps_avx(auVar33,auVar31);
          local_1140 = vandps_avx(local_1290,auVar35);
          auVar80._0_4_ = local_1140._0_4_ * 1.1920929e-07;
          auVar80._4_4_ = local_1140._4_4_ * 1.1920929e-07;
          auVar80._8_4_ = local_1140._8_4_ * 1.1920929e-07;
          auVar80._12_4_ = local_1140._12_4_ * 1.1920929e-07;
          uVar18 = CONCAT44(auVar80._4_4_,auVar80._0_4_);
          auVar74._0_8_ = uVar18 ^ 0x8000000080000000;
          auVar74._8_4_ = -auVar80._8_4_;
          auVar74._12_4_ = -auVar80._12_4_;
          auVar33 = vcmpps_avx(auVar33,auVar74,5);
          auVar32 = vmaxps_avx(local_1130,local_12a0);
          auVar32 = vmaxps_avx(auVar32,auVar31);
          auVar32 = vcmpps_avx(auVar32,auVar80,2);
          auVar33 = vorps_avx(auVar33,auVar32);
          if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar33[0xf] < '\0') {
            auVar45._0_4_ = local_10f0._0_4_ * fVar98;
            auVar45._4_4_ = local_10f0._4_4_ * fVar101;
            auVar45._8_4_ = local_10f0._8_4_ * fVar103;
            auVar45._12_4_ = local_10f0._12_4_ * fVar105;
            auVar75._0_4_ = fVar97 * local_1100._0_4_;
            auVar75._4_4_ = fVar90 * local_1100._4_4_;
            auVar75._8_4_ = fVar93 * local_1100._8_4_;
            auVar75._12_4_ = fVar95 * local_1100._12_4_;
            auVar31 = vfmsub213ps_fma(local_1100,local_1120,auVar45);
            auVar71._0_4_ = auVar52._0_4_ * fVar96;
            auVar71._4_4_ = auVar52._4_4_ * fVar86;
            auVar71._8_4_ = auVar52._8_4_ * fVar91;
            auVar71._12_4_ = auVar52._12_4_ * fVar94;
            auVar81._0_4_ = fVar97 * auVar51._0_4_;
            auVar81._4_4_ = fVar90 * auVar51._4_4_;
            auVar81._8_4_ = fVar93 * auVar51._8_4_;
            auVar81._12_4_ = fVar95 * auVar51._12_4_;
            auVar57 = vfmsub213ps_fma(auVar51,local_1110,auVar71);
            auVar32 = vandps_avx(auVar45,auVar35);
            auVar51 = vandps_avx(auVar71,auVar35);
            auVar32 = vcmpps_avx(auVar32,auVar51,1);
            local_1230 = vblendvps_avx(auVar57,auVar31,auVar32);
            auVar87._0_4_ = auVar53._0_4_ * fVar98;
            auVar87._4_4_ = auVar53._4_4_ * fVar101;
            auVar87._8_4_ = auVar53._8_4_ * fVar103;
            auVar87._12_4_ = auVar53._12_4_ * fVar105;
            auVar31 = vfmsub213ps_fma(auVar53,local_1120,auVar81);
            auVar46._0_4_ = auVar67._0_4_ * fVar96;
            auVar46._4_4_ = auVar67._4_4_ * fVar86;
            auVar46._8_4_ = auVar67._8_4_ * fVar91;
            auVar46._12_4_ = auVar67._12_4_ * fVar94;
            auVar57 = vfmsub213ps_fma(local_10f0,auVar41,auVar46);
            auVar32 = vandps_avx(auVar46,auVar35);
            auVar51 = vandps_avx(auVar81,auVar35);
            auVar32 = vcmpps_avx(auVar32,auVar51,1);
            local_1220 = vblendvps_avx(auVar31,auVar57,auVar32);
            auVar31 = vfmsub213ps_fma(auVar67,local_1110,auVar75);
            auVar52 = vfmsub213ps_fma(auVar52,auVar41,auVar87);
            auVar32 = vandps_avx(auVar75,auVar35);
            auVar51 = vandps_avx(auVar87,auVar35);
            auVar32 = vcmpps_avx(auVar32,auVar51,1);
            local_1210 = vblendvps_avx(auVar52,auVar31,auVar32);
            auVar36._0_4_ = local_1210._0_4_ * local_1390._4_4_;
            auVar36._4_4_ = local_1210._4_4_ * local_1390._4_4_;
            auVar36._8_4_ = local_1210._8_4_ * local_1390._4_4_;
            auVar36._12_4_ = local_1210._12_4_ * local_1390._4_4_;
            auVar32 = vfmadd213ps_fma(local_13a0,local_1220,auVar36);
            auVar32 = vfmadd213ps_fma(auVar109,local_1230,auVar32);
            auVar37._0_4_ = auVar32._0_4_ + auVar32._0_4_;
            auVar37._4_4_ = auVar32._4_4_ + auVar32._4_4_;
            auVar37._8_4_ = auVar32._8_4_ + auVar32._8_4_;
            auVar37._12_4_ = auVar32._12_4_ + auVar32._12_4_;
            auVar76._0_4_ = local_1210._0_4_ * fVar106;
            auVar76._4_4_ = local_1210._4_4_ * fVar112;
            auVar76._8_4_ = local_1210._8_4_ * fVar116;
            auVar76._12_4_ = local_1210._12_4_ * fVar92;
            auVar32 = vfmadd213ps_fma(local_1350,local_1220,auVar76);
            auVar51 = vfmadd213ps_fma(local_1340,local_1230,auVar32);
            auVar32 = vrcpps_avx(auVar37);
            auVar88._8_4_ = 0x3f800000;
            auVar88._0_8_ = 0x3f8000003f800000;
            auVar88._12_4_ = 0x3f800000;
            auVar31 = vfnmadd213ps_fma(auVar32,auVar37,auVar88);
            auVar32 = vfmadd132ps_fma(auVar31,auVar32,auVar32);
            local_1240._0_4_ = auVar32._0_4_ * (auVar51._0_4_ + auVar51._0_4_);
            local_1240._4_4_ = auVar32._4_4_ * (auVar51._4_4_ + auVar51._4_4_);
            local_1240._8_4_ = auVar32._8_4_ * (auVar51._8_4_ + auVar51._8_4_);
            local_1240._12_4_ = auVar32._12_4_ * (auVar51._12_4_ + auVar51._12_4_);
            auVar78 = ZEXT1664(local_1240);
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar77._4_4_ = uVar9;
            auVar77._0_4_ = uVar9;
            auVar77._8_4_ = uVar9;
            auVar77._12_4_ = uVar9;
            auVar32 = vcmpps_avx(auVar77,local_1240,2);
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar89._4_4_ = uVar9;
            auVar89._0_4_ = uVar9;
            auVar89._8_4_ = uVar9;
            auVar89._12_4_ = uVar9;
            auVar30 = ZEXT1664(auVar89);
            auVar51 = vcmpps_avx(local_1240,auVar89,2);
            auVar32 = vandps_avx(auVar32,auVar51);
            auVar51 = auVar33 & auVar32;
            if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar51[0xf] < '\0') {
              auVar33 = vandps_avx(auVar33,auVar32);
              auVar32 = vcmpps_avx(auVar37,_DAT_01f7aa10,4);
              auVar51 = auVar32 & auVar33;
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar51[0xf] < '\0') {
                local_1330 = vandps_avx(auVar33,auVar32);
                local_1280 = &local_13a9;
                auVar33 = vrcpps_avx(local_1290);
                auVar56._8_4_ = 0x3f800000;
                auVar56._0_8_ = 0x3f8000003f800000;
                auVar56._12_4_ = 0x3f800000;
                auVar32 = vfnmadd213ps_fma(local_1290,auVar33,auVar56);
                auVar32 = vfmadd132ps_fma(auVar32,auVar33,auVar33);
                auVar47._8_4_ = 0x219392ef;
                auVar47._0_8_ = 0x219392ef219392ef;
                auVar47._12_4_ = 0x219392ef;
                auVar33 = vcmpps_avx(local_1140,auVar47,5);
                auVar33 = vandps_avx(auVar32,auVar33);
                auVar26._0_4_ = local_12b0 * auVar33._0_4_;
                auVar26._4_4_ = fStack_12ac * auVar33._4_4_;
                auVar26._8_4_ = fStack_12a8 * auVar33._8_4_;
                auVar26._12_4_ = fStack_12a4 * auVar33._12_4_;
                local_1260 = vminps_avx(auVar26,auVar56);
                auVar27._0_4_ = auVar33._0_4_ * local_12a0._0_4_;
                auVar27._4_4_ = auVar33._4_4_ * local_12a0._4_4_;
                auVar27._8_4_ = auVar33._8_4_ * local_12a0._8_4_;
                auVar27._12_4_ = auVar33._12_4_ * local_12a0._12_4_;
                local_1250 = vminps_avx(auVar27,auVar56);
                auVar48._8_4_ = 0x7f800000;
                auVar48._0_8_ = 0x7f8000007f800000;
                auVar48._12_4_ = 0x7f800000;
                auVar33 = vblendvps_avx(auVar48,local_1240,local_1330);
                auVar32 = vshufps_avx(auVar33,auVar33,0xb1);
                auVar32 = vminps_avx(auVar32,auVar33);
                auVar51 = vshufpd_avx(auVar32,auVar32,1);
                auVar32 = vminps_avx(auVar51,auVar32);
                auVar33 = vcmpps_avx(auVar33,auVar32,0);
                auVar51 = local_1330 & auVar33;
                auVar32 = vpcmpeqd_avx(auVar32,auVar32);
                if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar51[0xf] < '\0') {
                  auVar32 = auVar33;
                }
                lVar19 = lVar19 + uVar22;
                auVar33 = vandps_avx(local_1330,auVar32);
                uVar9 = vmovmskps_avx(auVar33);
                lVar14 = 0;
                for (uVar18 = CONCAT44((int)((ulong)context >> 0x20),uVar9); (uVar18 & 1) == 0;
                    uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar14 = lVar14 + 1;
                }
                uStack_1378 = auVar109._8_8_;
                local_1380 = context->scene;
                pSVar13 = context->scene;
                local_1270 = local_1330;
                do {
                  uVar11 = *(uint *)(lVar19 + 0x120 + lVar14 * 4);
                  uVar18 = (ulong)uVar11;
                  pGVar4 = (pSVar13->geometries).items[uVar18].ptr;
                  local_13a0._0_8_ = pGVar4;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_1330 + lVar14 * 4) = 0;
                  }
                  else {
                    local_1390 = lVar14;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar9 = *(undefined4 *)(local_1260 + lVar14 * 4);
                      uVar1 = *(undefined4 *)(local_1250 + lVar14 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_1240 + lVar14 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x180) =
                           *(undefined4 *)(local_1230 + lVar14 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) =
                           *(undefined4 *)(local_1220 + lVar14 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1c0) =
                           *(undefined4 *)(local_1210 + lVar14 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar9;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)(lVar19 + 0x130 + lVar14 * 4);
                      *(uint *)(ray + k * 4 + 0x240) = uVar11;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar9 = *(undefined4 *)(local_1260 + lVar14 * 4);
                    local_1060._4_4_ = uVar9;
                    local_1060._0_4_ = uVar9;
                    local_1060._8_4_ = uVar9;
                    local_1060._12_4_ = uVar9;
                    local_1060._16_4_ = uVar9;
                    local_1060._20_4_ = uVar9;
                    local_1060._24_4_ = uVar9;
                    local_1060._28_4_ = uVar9;
                    local_1040 = *(undefined4 *)(local_1250 + lVar14 * 4);
                    uVar9 = *(undefined4 *)(lVar19 + 0x130 + lVar14 * 4);
                    local_1020._4_4_ = uVar9;
                    local_1020._0_4_ = uVar9;
                    local_1020._8_4_ = uVar9;
                    local_1020._12_4_ = uVar9;
                    local_1020._16_4_ = uVar9;
                    local_1020._20_4_ = uVar9;
                    local_1020._24_4_ = uVar9;
                    local_1020._28_4_ = uVar9;
                    uVar9 = *(undefined4 *)(local_1230 + lVar14 * 4);
                    local_10c0._4_4_ = uVar9;
                    local_10c0._0_4_ = uVar9;
                    local_10c0._8_4_ = uVar9;
                    local_10c0._12_4_ = uVar9;
                    register0x00001310 = uVar9;
                    register0x00001314 = uVar9;
                    register0x00001318 = uVar9;
                    register0x0000131c = uVar9;
                    uVar9 = *(undefined4 *)(local_1220 + lVar14 * 4);
                    local_10a0._4_4_ = uVar9;
                    local_10a0._0_4_ = uVar9;
                    local_10a0._8_4_ = uVar9;
                    local_10a0._12_4_ = uVar9;
                    local_10a0._16_4_ = uVar9;
                    local_10a0._20_4_ = uVar9;
                    local_10a0._24_4_ = uVar9;
                    local_10a0._28_4_ = uVar9;
                    uVar9 = *(undefined4 *)(local_1210 + lVar14 * 4);
                    local_1080._4_4_ = uVar9;
                    local_1080._0_4_ = uVar9;
                    local_1080._8_4_ = uVar9;
                    local_1080._12_4_ = uVar9;
                    local_1080._16_4_ = uVar9;
                    local_1080._20_4_ = uVar9;
                    local_1080._24_4_ = uVar9;
                    local_1080._28_4_ = uVar9;
                    auVar49._4_4_ = uVar11;
                    auVar49._0_4_ = uVar11;
                    auVar49._8_4_ = uVar11;
                    auVar49._12_4_ = uVar11;
                    auVar50._16_4_ = uVar11;
                    auVar50._0_16_ = auVar49;
                    auVar50._20_4_ = uVar11;
                    auVar50._24_4_ = uVar11;
                    auVar50._28_4_ = uVar11;
                    uStack_103c = local_1040;
                    uStack_1038 = local_1040;
                    uStack_1034 = local_1040;
                    uStack_1030 = local_1040;
                    uStack_102c = local_1040;
                    uStack_1028 = local_1040;
                    uStack_1024 = local_1040;
                    local_1000 = auVar50;
                    vpcmpeqd_avx2(local_1060,local_1060);
                    uStack_fdc = context->user->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = context->user->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1240 + lVar14 * 4);
                    local_1200 = local_10e0;
                    local_12f0.valid = (int *)local_1200;
                    local_12f0.geometryUserPtr = pGVar4->userPtr;
                    local_12f0.context = context->user;
                    local_12f0.hit = local_10c0;
                    local_12f0.N = 8;
                    local_12f0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_1340._0_8_ = lVar16;
                      local_1350._0_8_ = lVar19;
                      local_1360 = auVar78._0_16_;
                      local_1370 = auVar30._0_16_;
                      auVar50 = ZEXT1632(auVar49);
                      (*pGVar4->intersectionFilterN)(&local_12f0);
                      auVar30 = ZEXT1664(local_1370);
                      auVar78 = ZEXT1664(local_1360);
                      k = local_1318;
                      lVar16 = local_1340._0_8_;
                      uVar17 = local_13a8;
                      ray = local_1310;
                      lVar19 = local_1350._0_8_;
                    }
                    auVar29 = vpcmpeqd_avx2(local_1200,_DAT_01faff00);
                    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                    auVar39 = auVar50 & ~auVar29;
                    if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar39 >> 0x7f,0) == '\0') &&
                          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar39 >> 0xbf,0) == '\0') &&
                        (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar39[0x1f]) {
                      auVar29 = auVar29 ^ auVar50;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_13a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        local_1340._0_8_ = lVar16;
                        local_1350._0_8_ = lVar19;
                        local_1360 = auVar78._0_16_;
                        local_1370 = auVar30._0_16_;
                        auVar50 = ZEXT1632(auVar50._0_16_);
                        (*p_Var5)(&local_12f0);
                        auVar30 = ZEXT1664(local_1370);
                        auVar78 = ZEXT1664(local_1360);
                        k = local_1318;
                        lVar16 = local_1340._0_8_;
                        uVar17 = local_13a8;
                        ray = local_1310;
                        lVar19 = local_1350._0_8_;
                      }
                      auVar6 = vpcmpeqd_avx2(local_1200,_DAT_01faff00);
                      auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                      auVar29 = auVar6 ^ auVar50;
                      auVar39 = auVar50 & ~auVar6;
                      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar39 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar39 >> 0x7f,0) != '\0') ||
                            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar39 >> 0xbf,0) != '\0') ||
                          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar39[0x1f] < '\0') {
                        auVar40._0_4_ = auVar6._0_4_ ^ auVar50._0_4_;
                        auVar40._4_4_ = auVar6._4_4_ ^ auVar50._4_4_;
                        auVar40._8_4_ = auVar6._8_4_ ^ auVar50._8_4_;
                        auVar40._12_4_ = auVar6._12_4_ ^ auVar50._12_4_;
                        auVar40._16_4_ = auVar6._16_4_ ^ auVar50._16_4_;
                        auVar40._20_4_ = auVar6._20_4_ ^ auVar50._20_4_;
                        auVar40._24_4_ = auVar6._24_4_ ^ auVar50._24_4_;
                        auVar40._28_4_ = auVar6._28_4_ ^ auVar50._28_4_;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])local_12f0.hit);
                        *(undefined1 (*) [32])(local_12f0.ray + 0x180) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x1a0) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x1c0) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x1e0) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x200) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x220) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x240) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x260) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x280) = auVar39;
                      }
                    }
                    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar29 >> 0x7f,0) == '\0') &&
                          (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar29 >> 0xbf,0) == '\0') &&
                        (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar29[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar30._0_4_;
                    }
                    else {
                      auVar30 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_1330 + local_1390 * 4) = 0;
                    uVar9 = auVar30._0_4_;
                    auVar28._4_4_ = uVar9;
                    auVar28._0_4_ = uVar9;
                    auVar28._8_4_ = uVar9;
                    auVar28._12_4_ = uVar9;
                    auVar33 = vcmpps_avx(auVar78._0_16_,auVar28,2);
                    local_1330 = vandps_avx(auVar33,local_1330);
                    uVar18 = local_1390;
                  }
                  if ((((local_1330 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1330 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1330 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1330[0xf]) break;
                  auVar38._8_4_ = 0x7f800000;
                  auVar38._0_8_ = 0x7f8000007f800000;
                  auVar38._12_4_ = 0x7f800000;
                  auVar33 = vblendvps_avx(auVar38,auVar78._0_16_,local_1330);
                  auVar32 = vshufps_avx(auVar33,auVar33,0xb1);
                  auVar32 = vminps_avx(auVar32,auVar33);
                  auVar51 = vshufpd_avx(auVar32,auVar32,1);
                  auVar32 = vminps_avx(auVar51,auVar32);
                  auVar32 = vcmpps_avx(auVar33,auVar32,0);
                  auVar51 = local_1330 & auVar32;
                  auVar33 = local_1330;
                  if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar51[0xf] < '\0') {
                    auVar33 = vandps_avx(auVar32,local_1330);
                  }
                  uVar9 = vmovmskps_avx(auVar33);
                  lVar14 = 0;
                  for (uVar18 = CONCAT44((int)(uVar18 >> 0x20),uVar9); pSVar13 = local_1380,
                      (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    lVar14 = lVar14 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != local_1308);
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
      auVar82 = ZEXT1664(local_1150);
      auVar84 = ZEXT1664(local_1160);
      auVar85 = ZEXT1664(local_1170);
      auVar78 = ZEXT1664(local_12c0);
      fVar86 = local_1180;
      fVar90 = fStack_117c;
      fVar91 = fStack_1178;
      fVar92 = fStack_1174;
      fVar93 = local_1190;
      fVar94 = fStack_118c;
      fVar95 = fStack_1188;
      fVar96 = fStack_1184;
      fVar98 = local_11a0;
      fVar101 = fStack_119c;
      fVar103 = fStack_1198;
      fVar97 = fStack_1194;
      fVar105 = local_11b0;
      fVar102 = fStack_11ac;
      fVar104 = fStack_11a8;
      fVar106 = fStack_11a4;
      fVar107 = local_11c0;
      fVar110 = fStack_11bc;
      fVar111 = fStack_11b8;
      fVar112 = fStack_11b4;
      fVar113 = local_11d0;
      fVar114 = fStack_11cc;
      fVar115 = fStack_11c8;
      fVar116 = fStack_11c4;
    }
    if (pauVar10 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }